

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalfd-test.c
# Opt level: O0

void * signalfd__multiple_readers_thread(void *arg)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  ssize_t s;
  signalfd_siginfo fdsi;
  int ec;
  int sfd;
  sigset_t mask;
  pthread_barrier_t *barrier;
  void *arg_local;
  
  mask.__val[0xf] = (unsigned_long)arg;
  iVar1 = sigemptyset((sigset_t *)&ec);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/signalfd-test.c"
               ,0x23e,"sigemptyset(&mask) == 0");
  }
  iVar1 = sigaddset((sigset_t *)&ec,10);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/signalfd-test.c"
               ,0x23f,"sigaddset(&mask, SIGUSR1) == 0");
  }
  fdsi.__pad._24_4_ = signalfd(-1,(sigset_t *)&ec,0x800);
  if ((int)fdsi.__pad._24_4_ < 0) {
    piVar2 = __errno_location();
    microatf_fail_require
              ("%s:%d: errno: %d",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/signalfd-test.c"
               ,0x241,*piVar2);
  }
  fdsi.__pad._20_4_ = pthread_barrier_wait((pthread_barrier_t *)mask.__val[0xf]);
  if ((fdsi.__pad._20_4_ != 0) && (fdsi.__pad._20_4_ != -1)) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/signalfd-test.c"
               ,0x245,"ec == 0 || ec == PTHREAD_BARRIER_SERIAL_THREAD");
  }
  while (signalfd__multiple_readers_count == 0) {
    sVar3 = read(fdsi.__pad._24_4_,&s,0x80);
    if ((sVar3 != 0x80) && ((-1 < sVar3 || (piVar2 = __errno_location(), *piVar2 != 0xb)))) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/signalfd-test.c"
                 ,0x24c,
                 "s == (ssize_t)sizeof(struct signalfd_siginfo) || (s < 0 && errno == EAGAIN)");
    }
    if (sVar3 == 0x80) {
      LOCK();
      signalfd__multiple_readers_count = signalfd__multiple_readers_count + 1;
      UNLOCK();
    }
  }
  iVar1 = close(fdsi.__pad._24_4_);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/signalfd-test.c"
               ,0x252,"close(sfd) == 0");
  }
  return (void *)0x0;
}

Assistant:

static void *
signalfd__multiple_readers_thread(void *arg)
{
	pthread_barrier_t *barrier = arg;

	sigset_t mask;
	ATF_REQUIRE(sigemptyset(&mask) == 0);
	ATF_REQUIRE(sigaddset(&mask, SIGUSR1) == 0);
	int sfd = signalfd(-1, &mask, SFD_NONBLOCK);
	ATF_REQUIRE_MSG(sfd >= 0, "errno: %d", errno);

	{
		int ec = pthread_barrier_wait(barrier);
		ATF_REQUIRE(ec == 0 || ec == PTHREAD_BARRIER_SERIAL_THREAD);
	}

	while (signalfd__multiple_readers_count == 0) {
		struct signalfd_siginfo fdsi;
		ssize_t s = read(sfd, &fdsi, sizeof(struct signalfd_siginfo));
		ATF_REQUIRE(s == (ssize_t)sizeof(struct signalfd_siginfo) ||
		    (s < 0 && errno == EAGAIN));
		if (s == (ssize_t)sizeof(struct signalfd_siginfo)) {
			++signalfd__multiple_readers_count;
		}
	}

	ATF_REQUIRE(close(sfd) == 0);

	return NULL;
}